

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_dopaste(_glist *x,_binbuf *b)

{
  _class **pp_Var1;
  _instanceeditor *p_Var2;
  t_gobj *ptVar3;
  t_selection *ptVar4;
  _glist *x_00;
  _class **pp_Var5;
  _class **pp_Var6;
  int oldstate;
  t_symbol *ptVar7;
  t_gobj **pptVar8;
  t_symbol *ptVar9;
  t_gotfn p_Var10;
  uint uVar11;
  t_selection **pptVar12;
  t_gobj **pptVar13;
  uint uVar14;
  
  oldstate = canvas_suspend_dsp();
  ptVar7 = gensym("#A");
  pp_Var6 = s__X.s_thing;
  pp_Var5 = s__N.s_thing;
  pp_Var1 = ptVar7->s_thing;
  ptVar7->s_thing = (_class **)0x0;
  s__N.s_thing = &pd_canvasmaker;
  s__X.s_thing = (_class **)x;
  canvas_editmode(x,1.0);
  glist_noselect(x);
  uVar14 = 0;
  pptVar13 = &x->gl_list;
  for (pptVar8 = pptVar13; *pptVar8 != (t_gobj *)0x0; pptVar8 = &(*pptVar8)->g_next) {
    uVar14 = uVar14 + 1;
  }
  p_Var2 = (pd_maininstance.pd_gui)->i_editor;
  *(uint *)(p_Var2 + 0x68) = uVar14;
  *(_glist **)(p_Var2 + 0x70) = x;
  uVar11 = 0;
  binbuf_eval(b,(t_pd *)0x0,0,(t_atom *)0x0);
  while (ptVar3 = *pptVar13, ptVar3 != (t_gobj *)0x0) {
    if (uVar14 <= uVar11) {
      glist_select(x,ptVar3);
    }
    uVar11 = uVar11 + 1;
    pptVar13 = &ptVar3->g_next;
  }
  *(undefined8 *)((pd_maininstance.pd_gui)->i_editor + 0x70) = 0;
  canvas_resume_dsp(oldstate);
  canvas_dirty(x,1.0);
  if ((x->field_0xe8 & 2) != 0) {
    pdgui_vmess("pdtk_canvas_getscroll","c",x);
  }
  if ((sys_noloadbang == 0) && (x->gl_editor != (t_editor *)0x0)) {
    pptVar12 = &x->gl_editor->e_selection;
    while (ptVar4 = *pptVar12, ptVar4 != (t_selection *)0x0) {
      x_00 = (_glist *)ptVar4->sel_what;
      if ((x_00->gl_obj).te_g.g_pd == canvas_class) {
        canvas_loadbang(x_00);
      }
      else {
        ptVar9 = gensym("loadbang");
        p_Var10 = zgetfn((t_pd *)x_00,ptVar9);
        if (p_Var10 != (t_gotfn)0x0) {
          ptVar3 = ptVar4->sel_what;
          ptVar9 = gensym("loadbang");
          pd_vmess(&ptVar3->g_pd,ptVar9,"f",0);
        }
      }
      pptVar12 = &ptVar4->sel_next;
    }
  }
  ptVar7->s_thing = pp_Var1;
  s__X.s_thing = pp_Var6;
  s__N.s_thing = pp_Var5;
  return;
}

Assistant:

static void canvas_dopaste(t_canvas *x, t_binbuf *b)
{
    t_gobj *g2;
    int dspstate = canvas_suspend_dsp(), nbox, count;
    t_symbol *asym = gensym("#A");
        /* save and clear bindings to symbols #A, #N, #X; restore when done */
    t_pd *boundx = s__X.s_thing, *bounda = asym->s_thing,
        *boundn = s__N.s_thing;
    asym->s_thing = 0;
    s__X.s_thing = &x->gl_pd;
    s__N.s_thing = &pd_canvasmaker;

    canvas_editmode(x, 1.);
    glist_noselect(x);
    for (g2 = x->gl_list, nbox = 0; g2; g2 = g2->g_next) nbox++;

    EDITOR->paste_onset = nbox;
    EDITOR->paste_canvas = x;

    binbuf_eval(b, 0, 0, 0);
    for (g2 = x->gl_list, count = 0; g2; g2 = g2->g_next, count++)
        if (count >= nbox)
            glist_select(x, g2);
    EDITOR->paste_canvas = 0;
    canvas_resume_dsp(dspstate);
    canvas_dirty(x, 1);
    if (x->gl_mapped)
        pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    if (!sys_noloadbang)
        glist_donewloadbangs(x);
    asym->s_thing = bounda;
    s__X.s_thing = boundx;
    s__N.s_thing = boundn;
}